

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall MemoryBufferTest_MoveCtor_Test::TestBody(MemoryBufferTest_MoveCtor_Test *this)

{
  char *pcVar1;
  AssertHelper local_b8;
  allocator<char> alloc;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  undefined1 local_88 [16];
  char test [5];
  char *inline_buffer_ptr;
  basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_> buffer;
  basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_> buffer2;
  
  buffer.super_allocator_ref<std::allocator<char>_>.alloc_ = &alloc;
  buffer.super_basic_buffer<char>.ptr_ = buffer.store_;
  buffer.super_basic_buffer<char>.size_ = 0;
  buffer.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_00264610;
  buffer.super_basic_buffer<char>.capacity_ = 5;
  builtin_strncpy(test,"test",5);
  fmt::v5::internal::basic_buffer<char>::append<char>
            (&buffer.super_basic_buffer<char>,test,test + 4);
  check_move_buffer("test",&buffer);
  buffer2.super_basic_buffer<char>._vptr_basic_buffer._0_1_ = 0x61;
  fmt::v5::internal::basic_buffer<char>::push_back
            (&buffer.super_basic_buffer<char>,(char *)&buffer2);
  check_move_buffer("testa",&buffer);
  inline_buffer_ptr = buffer.super_basic_buffer<char>.ptr_;
  buffer2.super_basic_buffer<char>._vptr_basic_buffer._0_1_ = 0x62;
  fmt::v5::internal::basic_buffer<char>::push_back
            (&buffer.super_basic_buffer<char>,(char *)&buffer2);
  fmt::v5::basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_>::
  basic_memory_buffer(&buffer2,&buffer);
  gtest_ar_1._0_8_ = buffer.super_basic_buffer<char>.ptr_;
  testing::internal::CmpHelperEQ<char_const*,char*>
            ((internal *)&gtest_ar,"inline_buffer_ptr","&buffer[0]",&inline_buffer_ptr,
             (char **)&gtest_ar_1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x13c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar._0_8_ = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar,buffer2.super_basic_buffer<char>.ptr_,
             buffer2.super_basic_buffer<char>.ptr_ + buffer2.super_basic_buffer<char>.size_);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"testab\"","std::string(&buffer2[0], buffer2.size())",
             (char (*) [7])"testab",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x13d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar_1._0_8_ = buffer2.super_basic_buffer<char>.capacity_;
  local_b8.data_._0_4_ = 5;
  testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
            ((internal *)&gtest_ar,"buffer2.capacity()","5u",(unsigned_long *)&gtest_ar_1,
             (uint *)&local_b8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x13e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  fmt::v5::basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_>::
  ~basic_memory_buffer(&buffer2);
  fmt::v5::basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_>::
  ~basic_memory_buffer(&buffer);
  return;
}

Assistant:

TEST(MemoryBufferTest, MoveCtor) {
  std::allocator<char> alloc;
  basic_memory_buffer<char, 5, TestAllocator> buffer((TestAllocator(&alloc)));
  const char test[] = "test";
  buffer.append(test, test + 4);
  check_move_buffer("test", buffer);
  // Adding one more character fills the inline buffer, but doesn't cause
  // dynamic allocation.
  buffer.push_back('a');
  check_move_buffer("testa", buffer);
  const char *inline_buffer_ptr = &buffer[0];
  // Adding one more character causes the content to move from the inline to
  // a dynamically allocated buffer.
  buffer.push_back('b');
  basic_memory_buffer<char, 5, TestAllocator> buffer2(std::move(buffer));
  // Move should rip the guts of the first buffer.
  EXPECT_EQ(inline_buffer_ptr, &buffer[0]);
  EXPECT_EQ("testab", std::string(&buffer2[0], buffer2.size()));
  EXPECT_GT(buffer2.capacity(), 5u);
}